

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fstack.cpp
# Opt level: O1

void fstk_AddIncludePath(char *path)

{
  uint uVar1;
  size_t __n;
  char *pcVar2;
  char *pcVar3;
  int *piVar4;
  ulong uVar5;
  
  uVar1 = nbIncPaths;
  if (*path != '\0') {
    uVar5 = (ulong)nbIncPaths;
    if (0x7f < uVar5) {
      error("Too many include directories passed from command line\n");
      return;
    }
    __n = strlen(path);
    pcVar2 = (char *)malloc(__n + (path[__n - 1] != '/') + 1);
    if (pcVar2 == (char *)0x0) {
      piVar4 = __errno_location();
      pcVar2 = strerror(*piVar4);
      error("Failed to allocate new include path: %s\n",pcVar2);
      return;
    }
    memcpy(pcVar2,path,__n);
    pcVar3 = pcVar2 + __n;
    if (pcVar2[__n - 1] != '/') {
      *pcVar3 = '/';
      pcVar3 = pcVar3 + 1;
    }
    *pcVar3 = '\0';
    nbIncPaths = uVar1 + 1;
    includePaths[uVar5] = pcVar2;
  }
  return;
}

Assistant:

void fstk_AddIncludePath(char const *path)
{
	if (path[0] == '\0')
		return;
	if (nbIncPaths >= MAXINCPATHS) {
		error("Too many include directories passed from command line\n");
		return;
	}
	size_t len = strlen(path);
	size_t allocSize = len + (path[len - 1] != '/') + 1;
	char *str = (char *)malloc(allocSize);

	if (!str) {
		// Attempt to continue without that path
		error("Failed to allocate new include path: %s\n", strerror(errno));
		return;
	}
	memcpy(str, path, len);
	char *end = str + len - 1;

	if (*end++ != '/')
		*end++ = '/';
	*end = '\0';
	includePaths[nbIncPaths++] = str;
}